

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

Vec_Int_t * Wlc_ReduceMarkedInitVec(Wlc_Ntk_t *p,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Wlc_Obj_t *p_01;
  int local_30;
  int local_2c;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vInitNew;
  Vec_Int_t *vInit_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Vec_IntDup(vInit);
  local_30 = 0;
  iVar1 = Vec_IntSize(vInit);
  iVar2 = Wlc_NtkCiNum(p);
  iVar3 = Wlc_NtkPiNum(p);
  if (iVar1 != iVar2 - iVar3) {
    __assert_fail("Vec_IntSize(vInit) == Wlc_NtkCiNum(p) - Wlc_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                  ,0x365,"Vec_Int_t *Wlc_ReduceMarkedInitVec(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  for (local_2c = 0; iVar1 = Wlc_NtkCiNum(p), local_2c < iVar1; local_2c = local_2c + 1) {
    p_01 = Wlc_NtkCi(p,local_2c);
    iVar1 = Wlc_ObjIsPi(p_01);
    if ((iVar1 == 0) && ((*(ushort *)p_01 >> 7 & 1) != 0)) {
      iVar1 = Wlc_NtkPiNum(p);
      iVar1 = Vec_IntEntry(vInit,local_2c - iVar1);
      Vec_IntWriteEntry(p_00,local_30,iVar1);
      local_30 = local_30 + 1;
    }
  }
  Vec_IntShrink(p_00,local_30);
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_ReduceMarkedInitVec( Wlc_Ntk_t * p, Vec_Int_t * vInit )
{
    Vec_Int_t * vInitNew = Vec_IntDup( vInit );
    Wlc_Obj_t * pObj; int i, k = 0;
    assert( Vec_IntSize(vInit) == Wlc_NtkCiNum(p) - Wlc_NtkPiNum(p) );
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !Wlc_ObjIsPi(pObj) && pObj->Mark )
            Vec_IntWriteEntry( vInitNew, k++, Vec_IntEntry(vInit, i - Wlc_NtkPiNum(p)) );
    Vec_IntShrink( vInitNew, k );
    return vInitNew;
}